

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float *pfVar1;
  float fVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  pcVar7 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[itime].super_RawBufferView.stride;
  uVar5 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  lVar16 = sVar8 * uVar5;
  fVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar11 = scale * r_scale0;
  fVar12 = fVar11 * fVar2 * *(float *)(pcVar7 + lVar16 + 0xc);
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar9 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar10 = pBVar6[itime].super_RawBufferView.stride;
  lVar17 = uVar5 * sVar10;
  pfVar1 = (float *)(pcVar9 + lVar17);
  auVar47._0_4_ = scale * *pfVar1;
  auVar47._4_4_ = scale * pfVar1[1];
  auVar47._8_4_ = scale * pfVar1[2];
  auVar47._12_4_ = scale * pfVar1[3];
  auVar54._4_4_ = fVar12;
  auVar54._0_4_ = fVar12;
  auVar54._8_4_ = fVar12;
  auVar54._12_4_ = fVar12;
  auVar29._16_4_ = fVar12;
  auVar29._0_16_ = auVar54;
  auVar29._20_4_ = fVar12;
  auVar29._24_4_ = fVar12;
  auVar29._28_4_ = fVar12;
  auVar43._4_4_ = auVar47._0_4_;
  auVar43._0_4_ = auVar47._0_4_;
  auVar43._8_4_ = auVar47._0_4_;
  auVar43._12_4_ = auVar47._0_4_;
  auVar20 = vshufps_avx(auVar47,auVar47,0x55);
  auVar18 = vshufps_avx(auVar47,auVar47,0xaa);
  aVar3 = (space->vx).field_0;
  aVar4 = (space->vy).field_0;
  fVar12 = (space->vz).field_0.m128[0];
  fVar13 = (space->vz).field_0.m128[1];
  fVar14 = (space->vz).field_0.m128[2];
  fVar15 = (space->vz).field_0.m128[3];
  auVar48._0_4_ = fVar12 * auVar18._0_4_;
  auVar48._4_4_ = fVar13 * auVar18._4_4_;
  auVar48._8_4_ = fVar14 * auVar18._8_4_;
  auVar48._12_4_ = fVar15 * auVar18._12_4_;
  auVar20 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar4,auVar20);
  auVar20 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar3,auVar43);
  auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)(fVar11 * fVar2 * *(float *)(pcVar9 + lVar17 + 0xc))
                                         ),0x30);
  auVar18 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar16),(undefined1  [16])ofs->field_0);
  auVar42._0_4_ = scale * auVar18._0_4_;
  auVar42._4_4_ = scale * auVar18._4_4_;
  auVar42._8_4_ = scale * auVar18._8_4_;
  auVar42._12_4_ = scale * auVar18._12_4_;
  auVar44._4_4_ = auVar42._0_4_;
  auVar44._0_4_ = auVar42._0_4_;
  auVar44._8_4_ = auVar42._0_4_;
  auVar44._12_4_ = auVar42._0_4_;
  auVar18 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar21._0_4_ = fVar12 * auVar42._0_4_;
  auVar21._4_4_ = fVar13 * auVar42._4_4_;
  auVar21._8_4_ = fVar14 * auVar42._8_4_;
  auVar21._12_4_ = fVar15 * auVar42._12_4_;
  auVar18 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar4,auVar18);
  auVar42 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar3,auVar44);
  auVar18 = vinsertps_avx(auVar42,auVar54,0x30);
  auVar53._8_4_ = 0xbeaaaaab;
  auVar53._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar53._12_4_ = 0xbeaaaaab;
  auVar41 = vfnmadd231ps_fma(auVar18,auVar53,auVar20);
  auVar24._8_4_ = 3;
  auVar24._0_8_ = 0x300000003;
  auVar24._12_4_ = 3;
  auVar24._16_4_ = 3;
  auVar24._20_4_ = 3;
  auVar24._24_4_ = 3;
  auVar24._28_4_ = 3;
  auVar22 = vpermps_avx512vl(auVar24,ZEXT1632(auVar41));
  lVar16 = sVar10 * (uVar5 + 1);
  pfVar1 = (float *)(pcVar9 + lVar16);
  auVar55._0_4_ = scale * *pfVar1;
  auVar55._4_4_ = scale * pfVar1[1];
  auVar55._8_4_ = scale * pfVar1[2];
  auVar55._12_4_ = scale * pfVar1[3];
  auVar18 = vbroadcastss_avx512vl(auVar55);
  auVar19 = vshufps_avx512vl(auVar55,auVar55,0x55);
  auVar20 = vshufps_avx(auVar55,auVar55,0xaa);
  auVar56._0_4_ = auVar20._0_4_ * fVar12;
  auVar56._4_4_ = auVar20._4_4_ * fVar13;
  auVar56._8_4_ = auVar20._8_4_ * fVar14;
  auVar56._12_4_ = auVar20._12_4_ * fVar15;
  auVar20 = vfmadd231ps_avx512vl(auVar56,(undefined1  [16])aVar4,auVar19);
  auVar20 = vfmadd231ps_avx512vl(auVar20,(undefined1  [16])aVar3,auVar18);
  auVar18 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416(*(uint *)(pcVar9 + lVar16 + 0xc)));
  auVar18 = vmulss_avx512f(ZEXT416((uint)fVar11),auVar18);
  auVar18 = vinsertps_avx512f(auVar20,auVar18,0x30);
  lVar16 = sVar8 * (uVar5 + 1);
  auVar20 = vsubps_avx512vl(*(undefined1 (*) [16])(pcVar7 + lVar16),(undefined1  [16])ofs->field_0);
  auVar39._0_4_ = auVar20._0_4_ * scale;
  auVar39._4_4_ = auVar20._4_4_ * scale;
  auVar39._8_4_ = auVar20._8_4_ * scale;
  auVar39._12_4_ = auVar20._12_4_ * scale;
  auVar19 = vbroadcastss_avx512vl(auVar39);
  auVar21 = vshufps_avx512vl(auVar39,auVar39,0x55);
  auVar20 = vshufps_avx(auVar39,auVar39,0xaa);
  auVar50._0_4_ = fVar12 * auVar20._0_4_;
  auVar50._4_4_ = fVar13 * auVar20._4_4_;
  auVar50._8_4_ = fVar14 * auVar20._8_4_;
  auVar50._12_4_ = fVar15 * auVar20._12_4_;
  auVar20 = vfmadd231ps_avx512vl(auVar50,(undefined1  [16])aVar4,auVar21);
  auVar19 = vfmadd231ps_avx512vl(auVar20,(undefined1  [16])aVar3,auVar19);
  fVar11 = fVar11 * fVar2 * *(float *)(pcVar7 + lVar16 + 0xc);
  auVar20._4_4_ = fVar11;
  auVar20._0_4_ = fVar11;
  auVar20._8_4_ = fVar11;
  auVar20._12_4_ = fVar11;
  auVar28._16_4_ = fVar11;
  auVar28._0_16_ = auVar20;
  auVar28._20_4_ = fVar11;
  auVar28._24_4_ = fVar11;
  auVar28._28_4_ = fVar11;
  auVar20 = vinsertps_avx(auVar19,auVar20,0x30);
  auVar20 = vfmadd231ps_fma(auVar20,auVar53,auVar18);
  auVar27 = vpermps_avx2(auVar24,ZEXT1632(auVar20));
  auVar23._0_4_ = bezier_basis0._3944_4_ * fVar11;
  auVar23._4_4_ = bezier_basis0._3948_4_ * fVar11;
  auVar23._8_4_ = bezier_basis0._3952_4_ * fVar11;
  auVar23._12_4_ = bezier_basis0._3956_4_ * fVar11;
  auVar23._16_4_ = bezier_basis0._3960_4_ * fVar11;
  auVar23._20_4_ = bezier_basis0._3964_4_ * fVar11;
  auVar23._24_4_ = bezier_basis0._3968_4_ * fVar11;
  auVar23._28_4_ = 0;
  auVar18 = vfmadd231ps_fma(auVar23,bezier_basis0._2788_32_,auVar27);
  auVar23 = vfmadd231ps_avx512vl(ZEXT1632(auVar18),bezier_basis0._1632_32_,auVar22);
  auVar24 = vfmadd231ps_avx512vl(auVar23,bezier_basis0._476_32_,auVar29);
  auVar25 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar26 = vmaxps_avx512vl(auVar25,auVar24);
  auVar23 = vmulps_avx512vl(auVar28,bezier_basis0._8568_32_);
  auVar18 = vfmadd231ps_fma(auVar23,bezier_basis0._7412_32_,auVar27);
  auVar27 = vfmadd231ps_avx512vl(ZEXT1632(auVar18),bezier_basis0._6256_32_,auVar22);
  auVar18 = vfmadd231ps_fma(auVar27,bezier_basis0._5100_32_,auVar29);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
  auVar28 = vmulps_avx512vl(ZEXT1632(auVar18),auVar22);
  auVar27 = vblendps_avx(auVar28,ZEXT832(0) << 0x20,1);
  auVar23 = vsubps_avx(auVar24,auVar27);
  auVar27 = vblendps_avx(auVar28,ZEXT832(0) << 0x20,0x80);
  auVar28 = vaddps_avx512vl(auVar24,auVar27);
  auVar27 = vmaxps_avx512vl(auVar23,auVar28);
  auVar29 = vmaxps_avx512vl(auVar26,auVar27);
  auVar32._8_4_ = 2;
  auVar32._0_8_ = 0x200000002;
  auVar32._12_4_ = 2;
  auVar32._16_4_ = 2;
  auVar32._20_4_ = 2;
  auVar32._24_4_ = 2;
  auVar32._28_4_ = 2;
  auVar26 = vpermps_avx512vl(auVar32,ZEXT1632(auVar42));
  auVar30 = vpermps_avx512vl(auVar32,ZEXT1632(auVar41));
  auVar31 = vpermps_avx512vl(auVar32,ZEXT1632(auVar20));
  auVar27 = vpermps_avx2(auVar32,ZEXT1632(auVar19));
  auVar32 = vmulps_avx512vl(auVar27,bezier_basis0._3944_32_);
  auVar32 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._2788_32_,auVar31);
  auVar32 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._1632_32_,auVar30);
  auVar32 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._476_32_,auVar26);
  auVar33 = vmaxps_avx512vl(auVar25,auVar32);
  auVar27 = vmulps_avx512vl(auVar27,bezier_basis0._8568_32_);
  auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._7412_32_,auVar31);
  auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._6256_32_,auVar30);
  auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._5100_32_,auVar26);
  auVar26 = vmulps_avx512vl(auVar27,auVar22);
  auVar38 = ZEXT832(0) << 0x20;
  auVar27 = vblendps_avx(auVar26,auVar38,1);
  auVar30 = vsubps_avx512vl(auVar32,auVar27);
  auVar27 = vblendps_avx(auVar26,auVar38,0x80);
  auVar31 = vaddps_avx512vl(auVar32,auVar27);
  auVar27 = vmaxps_avx512vl(auVar30,auVar31);
  auVar33 = vmaxps_avx512vl(auVar33,auVar27);
  auVar27 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar26 = vpermps_avx512vl(auVar27,ZEXT1632(auVar42));
  auVar34 = vpermps_avx512vl(auVar27,ZEXT1632(auVar41));
  auVar35 = vpermps_avx512vl(auVar27,ZEXT1632(auVar20));
  auVar27 = vpermps_avx512vl(auVar27,ZEXT1632(auVar19));
  auVar36 = vmulps_avx512vl(auVar27,bezier_basis0._3944_32_);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._2788_32_,auVar35);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._1632_32_,auVar34);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._476_32_,auVar26);
  auVar37 = vmaxps_avx512vl(auVar25,auVar36);
  auVar27 = vmulps_avx512vl(auVar27,bezier_basis0._8568_32_);
  auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._7412_32_,auVar35);
  auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._6256_32_,auVar34);
  auVar27 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._5100_32_,auVar26);
  auVar26 = vmulps_avx512vl(auVar27,auVar22);
  auVar27 = vblendps_avx(auVar26,auVar38,1);
  auVar34 = vsubps_avx512vl(auVar36,auVar27);
  auVar27 = vblendps_avx(auVar26,auVar38,0x80);
  auVar35 = vaddps_avx512vl(auVar36,auVar27);
  auVar27 = vmaxps_avx512vl(auVar34,auVar35);
  auVar37 = vmaxps_avx512vl(auVar37,auVar27);
  auVar26._0_4_ = auVar42._0_4_;
  auVar26._4_4_ = auVar26._0_4_;
  auVar26._8_4_ = auVar26._0_4_;
  auVar26._12_4_ = auVar26._0_4_;
  auVar26._16_4_ = auVar26._0_4_;
  auVar26._20_4_ = auVar26._0_4_;
  auVar26._24_4_ = auVar26._0_4_;
  auVar26._28_4_ = auVar26._0_4_;
  auVar46._0_4_ = auVar41._0_4_;
  auVar46._4_4_ = auVar46._0_4_;
  auVar46._8_4_ = auVar46._0_4_;
  auVar46._12_4_ = auVar46._0_4_;
  auVar46._16_4_ = auVar46._0_4_;
  auVar46._20_4_ = auVar46._0_4_;
  auVar46._24_4_ = auVar46._0_4_;
  auVar46._28_4_ = auVar46._0_4_;
  auVar52._0_4_ = auVar20._0_4_;
  auVar52._4_4_ = auVar52._0_4_;
  auVar52._8_4_ = auVar52._0_4_;
  auVar52._12_4_ = auVar52._0_4_;
  auVar52._16_4_ = auVar52._0_4_;
  auVar52._20_4_ = auVar52._0_4_;
  auVar52._24_4_ = auVar52._0_4_;
  auVar52._28_4_ = auVar52._0_4_;
  auVar51._0_4_ = auVar19._0_4_;
  auVar51._4_4_ = auVar51._0_4_;
  auVar51._8_4_ = auVar51._0_4_;
  auVar51._12_4_ = auVar51._0_4_;
  auVar51._16_4_ = auVar51._0_4_;
  auVar51._20_4_ = auVar51._0_4_;
  auVar51._24_4_ = auVar51._0_4_;
  auVar51._28_4_ = auVar51._0_4_;
  auVar27._4_4_ = auVar51._0_4_ * bezier_basis0._3948_4_;
  auVar27._0_4_ = auVar51._0_4_ * bezier_basis0._3944_4_;
  auVar27._8_4_ = auVar51._0_4_ * bezier_basis0._3952_4_;
  auVar27._12_4_ = auVar51._0_4_ * bezier_basis0._3956_4_;
  auVar27._16_4_ = auVar51._0_4_ * bezier_basis0._3960_4_;
  auVar27._20_4_ = auVar51._0_4_ * bezier_basis0._3964_4_;
  auVar27._24_4_ = auVar51._0_4_ * bezier_basis0._3968_4_;
  auVar27._28_4_ = bezier_basis0._3972_4_;
  auVar20 = vfmadd231ps_fma(auVar27,auVar52,bezier_basis0._2788_32_);
  auVar27 = vfmadd231ps_avx512vl(ZEXT1632(auVar20),auVar46,bezier_basis0._1632_32_);
  auVar38 = vfmadd231ps_avx512vl(auVar27,auVar26,bezier_basis0._476_32_);
  auVar25 = vmaxps_avx512vl(auVar25,auVar38);
  auVar27 = vmulps_avx512vl(auVar51,bezier_basis0._8568_32_);
  auVar20 = vfmadd231ps_fma(auVar27,bezier_basis0._7412_32_,auVar52);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),bezier_basis0._6256_32_,auVar46);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),bezier_basis0._5100_32_,auVar26);
  auVar22 = vmulps_avx512vl(ZEXT1632(auVar20),auVar22);
  auVar27 = vblendps_avx(auVar22,ZEXT832(0) << 0x20,1);
  auVar26 = vsubps_avx(auVar38,auVar27);
  auVar27 = vblendps_avx(auVar22,ZEXT832(0) << 0x20,0x80);
  auVar40._0_4_ = auVar38._0_4_ + auVar27._0_4_;
  auVar40._4_4_ = auVar38._4_4_ + auVar27._4_4_;
  auVar40._8_4_ = auVar38._8_4_ + auVar27._8_4_;
  auVar40._12_4_ = auVar38._12_4_ + auVar27._12_4_;
  auVar40._16_4_ = auVar38._16_4_ + auVar27._16_4_;
  auVar40._20_4_ = auVar38._20_4_ + auVar27._20_4_;
  auVar40._24_4_ = auVar38._24_4_ + auVar27._24_4_;
  auVar40._28_4_ = auVar38._28_4_ + auVar27._28_4_;
  auVar27 = vmaxps_avx(auVar26,auVar40);
  auVar27 = vmaxps_avx(auVar25,auVar27);
  auVar49._8_4_ = 0x7f800000;
  auVar49._0_8_ = 0x7f8000007f800000;
  auVar49._12_4_ = 0x7f800000;
  auVar49._16_4_ = 0x7f800000;
  auVar49._20_4_ = 0x7f800000;
  auVar49._24_4_ = 0x7f800000;
  auVar49._28_4_ = 0x7f800000;
  auVar22 = vminps_avx(auVar49,auVar24);
  auVar23 = vminps_avx512vl(auVar23,auVar28);
  auVar22 = vminps_avx(auVar22,auVar23);
  auVar23 = vminps_avx512vl(auVar49,auVar32);
  auVar24 = vminps_avx512vl(auVar30,auVar31);
  auVar23 = vminps_avx(auVar23,auVar24);
  auVar25 = vminps_avx512vl(auVar49,auVar36);
  auVar24 = vminps_avx(auVar34,auVar35);
  auVar24 = vminps_avx(auVar25,auVar24);
  auVar25 = vminps_avx(auVar49,auVar38);
  auVar26 = vminps_avx(auVar26,auVar40);
  auVar25 = vminps_avx(auVar25,auVar26);
  auVar26 = vshufps_avx(auVar25,auVar25,0xb1);
  auVar25 = vminps_avx(auVar25,auVar26);
  auVar26 = vshufpd_avx(auVar25,auVar25,5);
  auVar25 = vminps_avx(auVar25,auVar26);
  auVar20 = vminps_avx(auVar25._0_16_,auVar25._16_16_);
  auVar25 = vshufps_avx(auVar24,auVar24,0xb1);
  auVar24 = vminps_avx(auVar24,auVar25);
  auVar25 = vshufpd_avx(auVar24,auVar24,5);
  auVar24 = vminps_avx(auVar24,auVar25);
  auVar18 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar18 = vunpcklps_avx(auVar20,auVar18);
  auVar24 = vshufps_avx(auVar23,auVar23,0xb1);
  auVar23 = vminps_avx(auVar23,auVar24);
  auVar24 = vshufpd_avx(auVar23,auVar23,5);
  auVar23 = vminps_avx(auVar23,auVar24);
  auVar20 = vminps_avx(auVar23._0_16_,auVar23._16_16_);
  auVar42 = vinsertps_avx(auVar18,auVar20,0x28);
  auVar23 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar27 = vmaxps_avx(auVar27,auVar23);
  auVar23 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vmaxps_avx(auVar27,auVar23);
  auVar20 = vmaxps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar27 = vshufps_avx512vl(auVar37,auVar37,0xb1);
  auVar23 = vmaxps_avx512vl(auVar37,auVar27);
  auVar27 = vshufpd_avx(auVar23,auVar23,5);
  auVar27 = vmaxps_avx(auVar23,auVar27);
  auVar18 = vmaxps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar18 = vunpcklps_avx(auVar20,auVar18);
  auVar27 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar27 = vmaxps_avx(auVar33,auVar27);
  auVar23 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vmaxps_avx(auVar27,auVar23);
  auVar20 = vmaxps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar41 = vinsertps_avx(auVar18,auVar20,0x28);
  auVar27 = vshufps_avx(auVar22,auVar22,0xb1);
  auVar27 = vminps_avx(auVar22,auVar27);
  auVar22 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vminps_avx(auVar27,auVar22);
  auVar20 = vminss_avx(auVar27._0_16_,auVar27._16_16_);
  auVar27 = vshufps_avx512vl(auVar29,auVar29,0xb1);
  auVar22 = vmaxps_avx512vl(auVar29,auVar27);
  auVar27 = vshufpd_avx(auVar22,auVar22,5);
  auVar27 = vmaxps_avx(auVar22,auVar27);
  auVar18 = vmaxss_avx(auVar27._0_16_,auVar27._16_16_);
  auVar45._8_4_ = 0x7fffffff;
  auVar45._0_8_ = 0x7fffffff7fffffff;
  auVar45._12_4_ = 0x7fffffff;
  auVar20 = vandps_avx(auVar20,auVar45);
  auVar18 = vandps_avx(auVar18,auVar45);
  auVar20 = vmaxss_avx(auVar18,auVar20);
  auVar18._0_4_ = auVar20._0_4_;
  auVar18._4_4_ = auVar18._0_4_;
  auVar18._8_4_ = auVar18._0_4_;
  auVar18._12_4_ = auVar18._0_4_;
  auVar42 = vsubps_avx(auVar42,auVar18);
  auVar19._0_4_ = auVar41._0_4_ + auVar18._0_4_;
  auVar19._4_4_ = auVar41._4_4_ + auVar18._0_4_;
  auVar19._8_4_ = auVar41._8_4_ + auVar18._0_4_;
  auVar19._12_4_ = auVar41._12_4_ + auVar18._0_4_;
  auVar20 = vandps_avx(auVar42,auVar45);
  auVar18 = vandps_avx(auVar19,auVar45);
  auVar20 = vmaxps_avx(auVar20,auVar18);
  auVar18 = vmovshdup_avx(auVar20);
  auVar18 = vmaxss_avx(auVar18,auVar20);
  auVar20 = vshufpd_avx(auVar20,auVar20,1);
  auVar20 = vmaxss_avx(auVar20,auVar18);
  fVar2 = auVar20._0_4_ * 4.7683716e-07;
  auVar41._4_4_ = fVar2;
  auVar41._0_4_ = fVar2;
  auVar41._8_4_ = fVar2;
  auVar41._12_4_ = fVar2;
  aVar3 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar42,auVar41);
  (__return_storage_ptr__->lower).field_0 = aVar3;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar19._0_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar19._4_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar19._8_4_ + fVar2;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar19._12_4_ + fVar2;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }